

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

bool Diligent::LinuxFileSystem::FileExists(Char *strFilePath)

{
  int iVar1;
  string path;
  stat StatBuff;
  String local_c8;
  stat local_a8;
  
  std::__cxx11::string::string((string *)&local_c8,strFilePath,(allocator *)&local_a8);
  BasicFileSystem::CorrectSlashes(&local_c8,'\0');
  iVar1 = stat(local_c8._M_dataplus._M_p,&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return (local_a8.st_mode & 0xf000) != 0x4000 && iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::FileExists(const Char* strFilePath)
{
    std::string path{strFilePath};
    CorrectSlashes(path);

    struct stat StatBuff;
    if (stat(path.c_str(), &StatBuff) != 0)
        return false;

    return !S_ISDIR(StatBuff.st_mode);
}